

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

void __thiscall
crnd::static_huffman_data_model::~static_huffman_data_model(static_huffman_data_model *this)

{
  decoder_tables *p;
  uchar *p_00;
  
  p = this->m_pDecode_tables;
  if (p != (decoder_tables *)0x0) {
    if (p->m_lookup != (uint32 *)0x0) {
      crnd_free(p->m_lookup + -2);
    }
    if (p->m_sorted_symbol_order != (uint16 *)0x0) {
      crnd_free(p->m_sorted_symbol_order + -4);
    }
    crnd_free(p);
  }
  p_00 = (this->m_code_sizes).m_p;
  if (p_00 != (uchar *)0x0) {
    crnd_free(p_00);
    (this->m_code_sizes).m_p = (uchar *)0x0;
    (this->m_code_sizes).m_size = 0;
    (this->m_code_sizes).m_capacity = 0;
  }
  (this->m_code_sizes).m_alloc_failed = false;
  return;
}

Assistant:

static_huffman_data_model::~static_huffman_data_model() {
  if (m_pDecode_tables)
    crnd_delete(m_pDecode_tables);
}